

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

string * __thiscall
glcts::(anonymous_namespace)::GatherBase::TextBody_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  long lVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  byte local_c9;
  string local_c8 [32];
  string local_a8 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string str_if;
  GatherBase *this_local;
  
  str_if.field_2._8_8_ = this;
  (**(code **)(*this + 0x100))();
  std::operator+(&local_58,"    if (all(lessThanEqual(abs(tmp - ",&local_78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,"), vec4(0.039)))) {           \n");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  local_c9 = 0;
  (**(code **)(*this + 0xb8))(local_a8);
  lVar1 = std::__cxx11::string::find((char)local_a8,0x75);
  bVar2 = true;
  if (lVar1 == -1) {
    (**(code **)(*this + 0xb8))(local_c8);
    local_c9 = 1;
    lVar1 = std::__cxx11::string::find((char)local_c8,0x69);
    bVar2 = lVar1 != -1;
  }
  if ((local_c9 & 1) != 0) {
    std::__cxx11::string::~string(local_c8);
  }
  std::__cxx11::string::~string(local_a8);
  if (bVar2) {
    (**(code **)(*this + 0x100))(&local_130);
    std::operator+(&local_110,"    if (tmp == ",&local_130);
    std::operator+(&local_f0,&local_110,") {           \n");
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
  }
  (**(code **)(*this + 0xd0))(&local_230);
  std::operator+(&local_210,
                 "vec4 test_function(vec4 p) {                                                                         \n"
                 ,&local_230);
  std::operator+(&local_1f0,&local_210,"    mediump ");
  (**(code **)(*this + 0xb8))(&local_250);
  std::operator+(&local_1d0,&local_1f0,&local_250);
  std::operator+(&local_1b0,&local_1d0," tmp = ");
  (**(code **)(*this + 200))(&local_270);
  std::operator+(&local_190,&local_1b0,&local_270);
  std::operator+(&local_170,&local_190,";                                                   \n");
  std::operator+(&local_150,&local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::operator+(__return_storage_ptr__,&local_150,
                 "        return vec4(0.0, 1.0, 0.0, 1.0);                                                             \n    } else {                                                                                         \n        return vec4(float(tmp.x), float(tmp.y), float(tmp.z), float(tmp.w));                         \n    }                                                                                                \n}\n"
                );
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string TextBody()
	{
		std::string str_if = "    if (all(lessThanEqual(abs(tmp - " + Expected() + "), vec4(0.039)))) {           \n";
		if (Type().find('u') != std::string::npos || Type().find('i') != std::string::npos)
		{
			str_if = "    if (tmp == " + Expected() + ") {           \n";
		}
		return "vec4 test_function(vec4 p) {                                                                         "
			   "\n" +
			   Offset() + "    mediump " + Type() + " tmp = " + Gather() +
			   ";                                                   \n" + str_if +
			   "        return vec4(0.0, 1.0, 0.0, 1.0);                                                             \n"
			   "    } else {                                                                                         \n"
			   "        return vec4(float(tmp.x), float(tmp.y), float(tmp.z), float(tmp.w));                         \n"
			   "    }                                                                                                \n"
			   "}\n";
	}